

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ipc_messages.cpp
# Opt level: O2

int test_ipcmsg_summary_with_testres(ITesting *t)

{
  pointer pAVar1;
  bool bVar2;
  __type_conflict4 _Var3;
  kTRContinueMode kVar4;
  int iVar5;
  IPCTestResults *pIVar6;
  pointer pAVar7;
  IPCTestResults *testResultsOut;
  Ref tr;
  IPCResultSummary local_190;
  Ref testResultIn;
  IPCResultSummary resultSummaryIn;
  AssertError assertError;
  UTest_IPC_VectorWriter vectorWriter;
  IPCBufferedWriter bufferedWriter;
  string local_a8;
  string local_88;
  IPCBinaryDecoder decoder;
  IPCBinaryEncoder encoder;
  UTest_IPC_VectorReader vectorReader;
  
  local_190.super_IPCSerializer._vptr_IPCSerializer = (_func_int **)&PTR__IPCResultSummary_0023d120;
  local_190.super_IPCDeserializer.super_IPCObject._vptr_IPCObject =
       (IPCObject)&PTR__IPCResultSummary_0023d158;
  local_190.testResults.
  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_190.testResults.
  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_190.testResults.
  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_190.testsExecuted = 1;
  local_190.testsFailed = 2;
  local_190.durationSec = 3.0;
  assertError._vptr_AssertError = (_func_int **)&PTR__AssertError_0023c770;
  assertError.assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  assertError.assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  assertError.assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"your hamster is a cat",(allocator<char> *)&resultSummaryIn);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"my_fine_file.cpp",(allocator<char> *)&bufferedWriter);
  trun::AssertError::Add(&assertError,kAssert_Error,0x1267,&local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&resultSummaryIn,"my_test_case",(allocator<char> *)&bufferedWriter);
  trun::TestResult::Create((string *)&tr);
  std::__cxx11::string::~string((string *)&resultSummaryIn);
  (tr.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->testResult =
       kTestResult_Pass;
  trun::TestResult::SetAssertError
            (tr.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&assertError
            );
  (tr.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->numAssert = 1;
  pIVar6 = (IPCTestResults *)operator_new(0x60);
  gnilk::IPCTestResults::IPCTestResults(pIVar6,&tr);
  testResultsOut = pIVar6;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&pIVar6->symbolName,"my_test_case");
  std::vector<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>::push_back
            (&local_190.testResults,&testResultsOut);
  vectorWriter.super_IPCWriter._vptr_IPCWriter = (_func_int **)&PTR_Write_0023c8d8;
  vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gnilk::IPCBufferedWriter::IPCBufferedWriter(&bufferedWriter,&vectorWriter.super_IPCWriter);
  encoder._0_8_ = &PTR_Write_0023cef8;
  encoder.writer = &bufferedWriter.super_IPCWriter;
  bVar2 = gnilk::IPCResultSummary::Marshal(&local_190,&encoder.super_IPCEncoderBase);
  iVar5 = 0x10;
  if (((!bVar2) &&
      (kVar4 = (*t->AssertError)(0x73,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                 ,"resultSummaryOut.Marshal(encoder)"), kVar4 == kTRLeave)) ||
     ((gnilk::IPCBufferedWriter::Flush(&bufferedWriter),
      vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish &&
      (kVar4 = (*t->AssertError)(0x77,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                 ,"!vectorWriter.Data().empty()"), kVar4 == kTRLeave))))
  goto LAB_00182142;
  vectorReader.data = &vectorWriter.data;
  decoder.reader = &vectorReader.super_IPCReader;
  vectorReader.super_IPCReader._vptr_IPCReader = (_func_int **)&PTR_Read_0023c928;
  vectorReader.idx = 0;
  decoder.deserializer = &resultSummaryIn.super_IPCDeserializer;
  resultSummaryIn.super_IPCSerializer._vptr_IPCSerializer =
       (_func_int **)&PTR__IPCResultSummary_0023d120;
  resultSummaryIn.super_IPCDeserializer.super_IPCObject._vptr_IPCObject =
       (IPCObject)&PTR__IPCResultSummary_0023d158;
  resultSummaryIn.testResults.
  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  resultSummaryIn.testsExecuted = 0;
  resultSummaryIn.testsFailed = 0;
  resultSummaryIn.durationSec = 0.0;
  resultSummaryIn.testResults.
  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  resultSummaryIn.testResults.
  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  decoder.super_IPCDecoderBase.super_IPCReader._vptr_IPCReader = (IPCReader)&PTR_Read_0023ce28;
  bVar2 = gnilk::IPCBinaryDecoder::Process(&decoder);
  if (((bVar2) ||
      (kVar4 = (*t->AssertError)(0x7f,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                 ,"decoder.Process()"), kVar4 != kTRLeave)) &&
     ((iVar5 = (*(decoder.reader)->_vptr_IPCReader[1])(), (char)iVar5 == '\0' ||
      (kVar4 = (*t->AssertError)(0x80,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                 ,"decoder.Available() == false"), kVar4 != kTRLeave)))) {
    if ((resultSummaryIn.testsExecuted != local_190.testsExecuted) &&
       (kVar4 = (*t->AssertError)(0x83,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                  ,"resultSummaryIn.testsExecuted == resultSummaryOut.testsExecuted"
                                 ), kVar4 == kTRLeave)) goto LAB_00182126;
    if ((resultSummaryIn.testsFailed != local_190.testsFailed) &&
       (kVar4 = (*t->AssertError)(0x84,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                  ,"resultSummaryIn.testsFailed == resultSummaryOut.testsFailed"),
       kVar4 == kTRLeave)) goto LAB_00182126;
    if ((((resultSummaryIn.durationSec != local_190.durationSec) ||
         (NAN(resultSummaryIn.durationSec) || NAN(local_190.durationSec))) &&
        (kVar4 = (*t->AssertError)(0x85,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                   ,"resultSummaryIn.durationSec == resultSummaryOut.durationSec"),
        kVar4 == kTRLeave)) ||
       (((long)resultSummaryIn.testResults.
               super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)resultSummaryIn.testResults.
               super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
               ._M_impl.super__Vector_impl_data._M_start !=
         (long)local_190.testResults.
               super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_190.testResults.
               super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
               ._M_impl.super__Vector_impl_data._M_start &&
        (kVar4 = (*t->AssertError)(0x86,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                   ,
                                   "resultSummaryIn.testResults.size() == resultSummaryOut.testResults.size()"
                                  ), kVar4 == kTRLeave)))) goto LAB_00182126;
    pIVar6 = *resultSummaryIn.testResults.
              super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    _Var3 = std::operator==(&pIVar6->symbolName,&testResultsOut->symbolName);
    if ((!_Var3) &&
       (kVar4 = (*t->AssertError)(0x88,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                  ,"first->symbolName == testResultsOut->symbolName"),
       kVar4 == kTRLeave)) goto LAB_00182126;
    std::__shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&testResultIn.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>,
               &(pIVar6->testResult).
                super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>);
    pAVar7 = ((testResultIn.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->assertError).assertErrors.
             super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)((testResultIn.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->assertError).assertErrors.
              super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar7 == 0x48) {
LAB_0018207a:
      pAVar1 = assertError.assertErrors.
               super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((((pAVar7->line !=
              (assertError.assertErrors.
               super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
               ._M_impl.super__Vector_impl_data._M_start)->line) &&
            (kVar4 = (*t->AssertError)(0x8e,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                       ,"assertErrorIn.line == assertErrorRef.line"),
            kVar4 == kTRLeave)) ||
           ((_Var3 = std::operator==(&pAVar7->file,&pAVar1->file), !_Var3 &&
            (kVar4 = (*t->AssertError)(0x8f,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                       ,"assertErrorIn.file == assertErrorRef.file"),
            kVar4 == kTRLeave)))) ||
          ((_Var3 = std::operator==(&pAVar7->message,&pAVar1->message), !_Var3 &&
           (kVar4 = (*t->AssertError)(0x90,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                      ,"assertErrorIn.message == assertErrorRef.message"),
           kVar4 == kTRLeave)))) ||
         ((pAVar7->assertClass != pAVar1->assertClass &&
          (kVar4 = (*t->AssertError)(0x91,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                     ,"assertErrorIn.assertClass == assertErrorRef.assertClass"),
          kVar4 == kTRLeave)))) goto LAB_0018212b;
      iVar5 = 0;
    }
    else {
      kVar4 = (*t->AssertError)(0x8a,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                ,"testResultIn->Asserts() == 1");
      if (kVar4 != kTRLeave) {
        pAVar7 = ((testResultIn.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->assertError).assertErrors.
                 super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_0018207a;
      }
LAB_0018212b:
      iVar5 = 0x10;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&testResultIn.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
LAB_00182126:
    iVar5 = 0x10;
  }
  gnilk::IPCResultSummary::~IPCResultSummary(&resultSummaryIn);
LAB_00182142:
  gnilk::IPCBufferedWriter::~IPCBufferedWriter(&bufferedWriter);
  UTest_IPC_VectorWriter::~UTest_IPC_VectorWriter(&vectorWriter);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tr.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  trun::AssertError::~AssertError(&assertError);
  gnilk::IPCResultSummary::~IPCResultSummary(&local_190);
  return iVar5;
}

Assistant:

DLL_EXPORT int test_ipcmsg_summary_with_testres(ITesting *t) {
    gnilk::IPCResultSummary resultSummaryOut;
    resultSummaryOut.testsExecuted = 1;
    resultSummaryOut.testsFailed = 2;
    resultSummaryOut.durationSec = 3.0;

    // Create a fake assert error
    trun::AssertError assertError;

    assertError.Add(trun::AssertError::kAssert_Error, 4711, "your hamster is a cat", "my_fine_file.cpp");

    auto tr = trun::TestResult::Create("my_test_case");
    tr->SetResult(trun::kTestResult::kTestResult_Pass);
    tr->SetAssertError(assertError);
    tr->SetNumberOfAsserts(1);  // Must be done explicitly..

    auto testResultsOut = new gnilk::IPCTestResults(tr);
    testResultsOut->symbolName = "my_test_case";
    resultSummaryOut.testResults.push_back(testResultsOut);


    UTest_IPC_VectorWriter vectorWriter;
    gnilk::IPCBufferedWriter bufferedWriter(vectorWriter);
    gnilk::IPCBinaryEncoder encoder(bufferedWriter);

    // Serialize
    TR_ASSERT(t, resultSummaryOut.Marshal(encoder));

    // Flush data - this will do the actual writing to the underlying writer
    bufferedWriter.Flush();
    TR_ASSERT(t, !vectorWriter.Data().empty());

    // Deserialize again
    UTest_IPC_VectorReader vectorReader(vectorWriter.Data());
    gnilk::IPCResultSummary resultSummaryIn;
    gnilk::IPCBinaryDecoder decoder(vectorReader, resultSummaryIn);

    // Deserialize
    TR_ASSERT(t, decoder.Process());
    TR_ASSERT(t, decoder.Available() == false);

    // Make sure we have everything
    TR_ASSERT(t, resultSummaryIn.testsExecuted == resultSummaryOut.testsExecuted);
    TR_ASSERT(t, resultSummaryIn.testsFailed == resultSummaryOut.testsFailed);
    TR_ASSERT(t, resultSummaryIn.durationSec == resultSummaryOut.durationSec);
    TR_ASSERT(t, resultSummaryIn.testResults.size() == resultSummaryOut.testResults.size());
    auto first = resultSummaryIn.testResults[0];
    TR_ASSERT(t, first->symbolName == testResultsOut->symbolName);
    auto testResultIn = first->testResult;
    TR_ASSERT(t, testResultIn->Asserts() == 1);
    // Verify the propagation of the assert error from above
    auto &assertErrorIn = testResultIn->AssertError().Errors().front();
    auto &assertErrorRef = assertError.Errors().front();
    TR_ASSERT(t, assertErrorIn.line == assertErrorRef.line);
    TR_ASSERT(t, assertErrorIn.file == assertErrorRef.file);
    TR_ASSERT(t, assertErrorIn.message == assertErrorRef.message);
    TR_ASSERT(t, assertErrorIn.assertClass == assertErrorRef.assertClass);


    return kTR_Pass;

}